

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::trytable<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  Lexer *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  size_t sVar3;
  char *pcVar4;
  optional<wasm::Name> label_00;
  undefined3 uVar5;
  bool bVar6;
  _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err> *p_Var7;
  undefined7 in_register_00000009;
  __index_type _Var8;
  _Alloc_hider _Var9;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_188 [8];
  Result<wasm::HeapType> type;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined1 auStack_140 [8];
  optional<wasm::Name> label;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  string local_108;
  string local_e8;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_c8;
  size_t local_c0;
  undefined1 auStack_b8 [8];
  vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  catches;
  undefined1 auStack_98 [8];
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> _val_1;
  undefined1 auStack_58 [8];
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> c;
  
  this = &ctx->in;
  local_c0 = (ctx->in).pos;
  local_c8 = annotations;
  if ((int)CONCAT71(in_register_00000009,folded) == 0) {
    expected_00._M_str = "try_table";
    expected_00._M_len = 9;
    bVar6 = Lexer::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "try_table";
    expected._M_len = 9;
    bVar6 = Lexer::takeSExprStart(this,expected);
  }
  if (bVar6 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)auStack_140,this);
  blocktype<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)local_188,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)auStack_58,
             (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_188);
  if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&_val_1.val.
                     super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     .
                     super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     .
                     super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     .
                     super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     .
                     super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             + 8);
    auStack_98 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_98,auStack_58,
               (undefined1 *)
               (c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if (auStack_98 == (undefined1  [8])puVar1) {
      *puVar2 = _val_1.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_98;
      *(char **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_1.val.
         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
         ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)auStack_58);
    goto LAB_00c0635e;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)auStack_58);
  auStack_b8 = (undefined1  [8])0x0;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (catchinstr<wasm::WATParser::ParseDefsCtx>
                   ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)auStack_58,ctx),
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ != '\x01') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     *)auStack_98,
                    (_Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     *)auStack_58);
    if (_val_1.val.
        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\x02') {
      type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_ = &local_150;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),auStack_98,
                 (undefined1 *)
                 (_val_1.val.
                  super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_98));
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      if ((undefined8 *)
          type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
          super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_ == &local_150) {
        *puVar2 = local_150;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_148;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) = local_150;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_158;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         *)auStack_98);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         *)auStack_58);
      goto LAB_00c06343;
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_98);
    p_Var7 = (_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              *)0x0;
    if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\0') {
      p_Var7 = (_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                *)auStack_58;
    }
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_str =
         (char *)*(undefined8 *)((long)&p_Var7->_M_u + 0x10);
    auStack_98 = (undefined1  [8])(p_Var7->_M_u)._M_first._M_storage.tag.super_IString.str._M_len;
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_len = *(size_t *)((long)&p_Var7->_M_u + 8);
    if (catches.
        super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        catches.
        super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<wasm::WATParser::ParseDefsCtx::CatchInfo,std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>>
      ::_M_realloc_insert<wasm::WATParser::ParseDefsCtx::CatchInfo_const&>
                ((vector<wasm::WATParser::ParseDefsCtx::CatchInfo,std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>>
                  *)auStack_b8,
                 (iterator)
                 catches.
                 super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start,(CatchInfo *)auStack_98);
    }
    else {
      sVar3 = (p_Var7->_M_u)._M_first._M_storage.tag.super_IString.str._M_len;
      pcVar4 = (p_Var7->_M_u)._M_first._M_storage.tag.super_IString.str._M_str;
      bVar6 = *(bool *)((long)&p_Var7->_M_u + 0x14);
      uVar5 = *(undefined3 *)((long)&p_Var7->_M_u + 0x15);
      (catches.
       super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
       ._M_impl.super__Vector_impl_data._M_start)->label = *(Index *)((long)&p_Var7->_M_u + 0x10);
      (catches.
       super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
       ._M_impl.super__Vector_impl_data._M_start)->isRef = bVar6;
      *(undefined3 *)
       &(catches.
         super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
         ._M_impl.super__Vector_impl_data._M_start)->field_0x15 = uVar5;
      ((catches.
        super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
        ._M_impl.super__Vector_impl_data._M_start)->tag).super_IString.str._M_len = sVar3;
      ((catches.
        super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
        ._M_impl.super__Vector_impl_data._M_start)->tag).super_IString.str._M_str = pcVar4;
      catches.
      super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
      ._M_impl.super__Vector_impl_data._M_start =
           catches.
           super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_58);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     *)auStack_58);
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._17_7_ =
       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._9_7_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged =
       (bool)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
       (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
  ;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
       (size_t)auStack_140;
  ParseDefsCtx::makeTryTable
            ((Result<wasm::Ok> *)auStack_58,ctx,(Index)local_c0,local_c8,label_00,
             (HeapType)local_188,
             (vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
              *)auStack_b8);
  if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._24_1_ == '\x01') {
    auStack_98 = (undefined1  [8])
                 ((long)&_val_1.val.
                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_98,auStack_58,
               (undefined1 *)
               (c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
LAB_00c062cb:
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if (auStack_98 ==
        (undefined1  [8])
        ((long)&_val_1.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        + 8U)) {
      *puVar2 = _val_1.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_98;
      *(char **)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           _val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_str;
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         _val_1.val.
         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
         super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
         ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
LAB_00c0633a:
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_58);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_58);
    instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)auStack_58,ctx);
    if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      auStack_98 = (undefined1  [8])
                   ((long)&_val_1.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                   + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)auStack_98,auStack_58,
                 (undefined1 *)
                 (c.val.
                  super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  .
                  super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                  ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
      goto LAB_00c062cb;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_58);
    if (folded) {
      bVar6 = Lexer::takeRParen(this);
      if (!bVar6) {
        label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._16_8_ = &local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged,
                   "expected \')\' at end of try_table","");
        Lexer::err((Err *)auStack_58,this,
                   (string *)
                   &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
        puVar1 = (undefined1 *)
                 ((long)&c.val.
                         super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         .
                         super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 + 8);
        if (auStack_58 == (undefined1  [8])puVar1) {
          *puVar2 = CONCAT71(c.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             ._M_u._9_7_,
                             c.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             ._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               c.val.
               super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               ._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        ._M_u._9_7_,
                        c.val.
                        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        .
                        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                        ._M_u._8_1_);
        }
        *(size_t *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             c.val.
             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_108.field_2._M_allocated_capacity = local_118._M_allocated_capacity;
        _Var9._M_p = (pointer)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::Name>._16_8_;
        auStack_58 = (undefined1  [8])puVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._16_8_ != &local_118) goto LAB_00c06610;
        goto LAB_00c06343;
      }
LAB_00c064bc:
      ParseDefsCtx::visitEnd((Result<wasm::Ok> *)auStack_58,ctx);
      if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          .super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          .super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
          ._M_u._24_1_ == '\x01') {
        *(undefined1 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             (undefined1 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        _Var8 = '\x02';
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,auStack_58,
                   (undefined1 *)
                   (c.val.
                    super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    .
                    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                    ._M_u._M_first._M_storage.tag.super_IString.str._M_len + (long)auStack_58));
      }
      else {
        _Var8 = '\0';
      }
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = _Var8;
      goto LAB_00c0633a;
    }
    expected_01._M_str = "end";
    expected_01._M_len = 3;
    bVar6 = Lexer::takeKeyword(this,expected_01);
    if (bVar6) {
      Lexer::takeID((optional<wasm::Name> *)auStack_98,this);
      if ((_val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._8_1_ != '\x01') ||
         ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
          (_val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len ==
           label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len))))
      goto LAB_00c064bc;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"end label does not match try_table label","");
      Lexer::err((Err *)auStack_58,this,&local_e8);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      puVar1 = (undefined1 *)
               ((long)&c.val.
                       super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               + 8);
      if (auStack_58 == (undefined1  [8])puVar1) {
        *puVar2 = CONCAT71(c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             c.val.
             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._9_7_,
                      c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._8_1_);
      }
      *(size_t *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           c.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_108.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
      _Var9._M_p = local_e8._M_dataplus._M_p;
      auStack_58 = (undefined1  [8])puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) goto LAB_00c06610;
    }
    else {
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,"expected \'end\' at end of try_table","");
      Lexer::err((Err *)auStack_58,this,&local_108);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      puVar1 = (undefined1 *)
               ((long)&c.val.
                       super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       .
                       super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               + 8);
      if (auStack_58 == (undefined1  [8])puVar1) {
        *puVar2 = CONCAT71(c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._9_7_,
                           c.val.
                           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           .
                           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                           ._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             c.val.
             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
             ._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = auStack_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._9_7_,
                      c.val.
                      super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      .
                      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                      ._M_u._8_1_);
      }
      *(size_t *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
           c.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
      c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      _Var9._M_p = local_108._M_dataplus._M_p;
      auStack_58 = (undefined1  [8])puVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
LAB_00c06610:
        auStack_58 = (undefined1  [8])
                     ((long)&c.val.
                             super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                             .
                             super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     + 8);
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._8_1_ = 0;
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._M_first._M_storage.tag.super_IString.str._M_len = 0;
        operator_delete(_Var9._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
    }
  }
LAB_00c06343:
  if (auStack_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_b8,
                    (long)catches.
                          super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_b8);
  }
LAB_00c0635e:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_188);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
trytable(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("try_table"sv)) ||
      (!folded && !ctx.in.takeKeyword("try_table"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto catches = ctx.makeCatchList();
  while (auto c = catchinstr(ctx)) {
    CHECK_ERR(c);
    ctx.appendCatch(catches, *c);
  }

  CHECK_ERR(ctx.makeTryTable(pos, annotations, label, *type, catches));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of try_table");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of try_table");
    }

    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match try_table label");
    }
  }
  return ctx.visitEnd();
}